

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlUTF8Strndup(xmlChar *utf,int len)

{
  int iVar1;
  int i;
  xmlChar *ret;
  int len_local;
  xmlChar *utf_local;
  
  if ((utf == (xmlChar *)0x0) || (len < 0)) {
    utf_local = (xmlChar *)0x0;
  }
  else {
    iVar1 = xmlUTF8Strsize(utf,len);
    utf_local = (xmlChar *)(*xmlMallocAtomic)((long)iVar1 + 1);
    if (utf_local == (xmlChar *)0x0) {
      utf_local = (xmlChar *)0x0;
    }
    else {
      memcpy(utf_local,utf,(long)iVar1);
      utf_local[iVar1] = '\0';
    }
  }
  return utf_local;
}

Assistant:

xmlChar *
xmlUTF8Strndup(const xmlChar *utf, int len) {
    xmlChar *ret;
    int i;

    if ((utf == NULL) || (len < 0)) return(NULL);
    i = xmlUTF8Strsize(utf, len);
    ret = (xmlChar *) xmlMallocAtomic((size_t) i + 1);
    if (ret == NULL) {
        return(NULL);
    }
    memcpy(ret, utf, i);
    ret[i] = 0;
    return(ret);
}